

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricDestroyExp(zet_metric_handle_t hMetric)

{
  zet_pfnMetricDestroyExp_t pfnDestroyExp;
  ze_result_t result;
  zet_metric_handle_t hMetric_local;
  
  pfnDestroyExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c878 != (code *)0x0) {
    pfnDestroyExp._4_4_ = (*DAT_0011c878)(hMetric);
  }
  return pfnDestroyExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDestroyExp(
        zet_metric_handle_t hMetric                     ///< [in] Handle of the metric to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zetDdiTable.MetricExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hMetric );
        }
        else
        {
            // generic implementation
        }

        return result;
    }